

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O3

void __thiscall
OneLevel_InsertThirdNode_Test::~OneLevel_InsertThirdNode_Test(OneLevel_InsertThirdNode_Test *this)

{
  (this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__OneLevel_0026d770;
  std::
  unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~unique_ptr(&(this->super_OneLevel).index_);
  (this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__IndexFixture_0026d6b0;
  pstore::database::~database
            (&(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.db_);
  in_memory_store::~in_memory_store
            (&(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x168);
  return;
}

Assistant:

TEST_F (OneLevel, InsertThirdNode) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    OneLevel::insert_or_assign (*index_, t1, "a");
    OneLevel::insert_or_assign (*index_, t1, "b");
    EXPECT_FALSE (this->is_found (*index_, "c")); // check "c" is not in the index.
    index_->flush (t1, db_.get_current_revision ());
    // The index root is a store internal node. To insert_or_assign a new node, the store internal
    // node need to be copied into the heap.
    std::pair<test_trie::iterator, bool> const itp = OneLevel::insert_or_assign (*index_, t1, "c");
    std::string const & key = (*itp.first).first;
    EXPECT_EQ ("c", key);
    EXPECT_TRUE (itp.second);

    EXPECT_EQ (3U, index_->size ());
    EXPECT_TRUE (this->is_found (*index_, "c")) << "key \"c\" should be present in the index";
    {
        auto root = index_->root ();
        this->check_is_heap_internal_node (root);
        internal_node const * const root_internal = root.untag<internal_node *> ();
        EXPECT_EQ (root_internal->get_bitmap (), 0b10001010U);
        this->check_is_leaf_node ((*root_internal)[2]);
        EXPECT_GT ((*root_internal)[2].to_address (), (*root_internal)[1].to_address ());
        EXPECT_GT ((*root_internal)[2].to_address (), (*root_internal)[0].to_address ());
        index_->flush (t1, db_.get_current_revision ());
        EXPECT_NE (root, index_->root ());
        EXPECT_TRUE (this->is_found (*index_, "c")) << "key \"c\" should be present in the index";
    }
}